

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent *indent)

{
  pointer pbVar1;
  cmTest *pcVar2;
  char cVar3;
  ostream *poVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  char *pcVar7;
  pointer pbVar8;
  allocator local_a1;
  cmTestGenerator *local_a0;
  Indent *local_98;
  string local_90;
  string exe;
  string local_50;
  
  this->TestGenerated = true;
  pcVar2 = this->Test;
  local_a0 = this;
  local_98 = indent;
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
  cmScriptGeneratorIndent::Write(local_98,fout);
  std::operator<<(fout,"add_test(");
  std::__cxx11::string::string((string *)&local_90,(string *)&local_a0->Test->Name);
  poVar4 = std::operator<<(fout,(string *)&local_90);
  poVar4 = std::operator<<(poVar4," \"");
  poVar4 = std::operator<<(poVar4,(string *)&exe);
  std::operator<<(poVar4,"\"");
  std::__cxx11::string::~string((string *)&local_90);
  pbVar8 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar1 = pbVar8 + 1,
        pbVar1 != (pcVar2->Command).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(fout," \"");
    pcVar5 = pbVar8[1]._M_dataplus._M_p;
    for (pcVar7 = pcVar5; pcVar7 != pcVar5 + pbVar8[1]._M_string_length; pcVar7 = pcVar7 + 1) {
      cVar3 = *pcVar7;
      if (cVar3 == '\"') {
        std::operator<<(fout,'\\');
        cVar3 = *pcVar7;
      }
      std::operator<<(fout,cVar3);
      pcVar5 = (pbVar1->_M_dataplus)._M_p;
    }
    std::operator<<(fout,"\"");
    pbVar8 = pbVar1;
  }
  poVar4 = std::operator<<(fout,")");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar2 = local_a0->Test;
  if ((pcVar2->Properties).
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmScriptGeneratorIndent::Write(local_98,fout);
    poVar4 = std::operator<<(fout,"set_tests_properties(");
    std::__cxx11::string::string((string *)&local_90,(string *)&local_a0->Test->Name);
    poVar4 = std::operator<<(poVar4,(string *)&local_90);
    std::operator<<(poVar4," PROPERTIES ");
    std::__cxx11::string::~string((string *)&local_90);
    for (p_Var6 = (pcVar2->Properties).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(pcVar2->Properties).
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      poVar4 = std::operator<<(fout," ");
      poVar4 = std::operator<<(poVar4,(string *)(p_Var6 + 1));
      poVar4 = std::operator<<(poVar4," ");
      pcVar5 = cmProperty::GetValue((cmProperty *)(p_Var6 + 2));
      std::__cxx11::string::string((string *)&local_50,pcVar5,&local_a1);
      cmOutputConverter::EscapeForCMake(&local_90,&local_50);
      std::operator<<(poVar4,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    poVar4 = std::operator<<(fout,")");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&exe);
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout,
                                       Indent const& indent)
{
  this->TestGenerated = true;

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  fout << indent;
  fout << "add_test(";
  fout << this->Test->GetName() << " \"" << exe << "\"";

  for(std::vector<std::string>::const_iterator argit = command.begin()+1;
      argit != command.end(); ++argit)
    {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for(std::string::const_iterator c = argit->begin();
        c != argit->end(); ++c)
      {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if((*c == '"'))
        {
        fout << '\\';
        }
      fout << *c;
      }
    fout << "\"";
    }
  fout << ")" << std::endl;

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if(!pm.empty())
    {
    fout << indent << "set_tests_properties(" << this->Test->GetName()
         << " PROPERTIES ";
    for(cmPropertyMap::const_iterator i = pm.begin();
        i != pm.end(); ++i)
      {
      fout << " " << i->first
           << " " << cmOutputConverter::EscapeForCMake(i->second.GetValue());
      }
    fout << ")" << std::endl;
    }
}